

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcTranslateToC(char *fileName,char *mainName,_func_void_char_ptr *addDependency)

{
  bool bVar1;
  int iVar2;
  nullres nVar3;
  TraceScope traceScope;
  TraceScope TStack_28;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcTranslateToC::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&nullcTranslateToC::token), iVar2 != 0)) {
    nullcTranslateToC::token = NULLC::TraceGetToken("nullc","nullcTranslateToC");
    __cxa_guard_release(&nullcTranslateToC::token);
  }
  NULLC::TraceScope::TraceScope(&TStack_28,nullcTranslateToC::token);
  if (NULLC::compilerCtx == (CompilerContext *)0x0) {
    NULLC::nullcLastError = "ERROR: there is no active compiler context";
  }
  else {
    bVar1 = TranslateToC(NULLC::compilerCtx,fileName,mainName,addDependency);
    nVar3 = '\x01';
    if (bVar1) goto LAB_001f31cf;
    NULLC::nullcLastError = NULLC::compilerCtx->errorBuf;
  }
  nVar3 = '\0';
LAB_001f31cf:
  NULLC::TraceScope::~TraceScope(&TStack_28);
  return nVar3;
}

Assistant:

nullres	nullcTranslateToC(const char *fileName, const char *mainName, void (*addDependency)(const char *fileName))
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	TRACE_SCOPE("nullc", "nullcTranslateToC");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	if(!TranslateToC(*compilerCtx, fileName, mainName, addDependency))
	{
		nullcLastError = compilerCtx->errorBuf;
		return 0;
	}

	return 1;
}